

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O3

Vec_Int_t * Bac_NameToRanges(char *pName)

{
  byte bVar1;
  int iVar2;
  
  Bac_NameToRanges::Bits.pArray = Bac_NameToRanges::pArray;
  Bac_NameToRanges::Bits.nCap = 10;
  Bac_NameToRanges::Bits.nSize = 0;
  iVar2 = strncmp(pName,"ABC_",4);
  if (iVar2 != 0) {
    __assert_fail("!strncmp(pName, s_Pref, strlen(s_Pref))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacNtk.c"
                  ,0xb7,"Vec_Int_t *Bac_NameToRanges(char *)");
  }
  bVar1 = *pName;
  while( true ) {
    if (bVar1 == 0) {
      __assert_fail("Bac_CharIsDigit(*pTemp)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacNtk.c"
                    ,0xb9,"Vec_Int_t *Bac_NameToRanges(char *)");
    }
    if (0xf5 < (byte)(bVar1 - 0x3a)) break;
    bVar1 = pName[1];
    pName = pName + 1;
  }
  iVar2 = 0;
  do {
    while ((byte)(bVar1 - 0x3a) < 0xf6) {
      Vec_IntPush(&Bac_NameToRanges::Bits,iVar2);
      bVar1 = pName[1];
      pName = pName + 1;
      iVar2 = 0;
      if (bVar1 == 0) goto LAB_003b3f09;
    }
    iVar2 = (uint)bVar1 + iVar2 * 10 + -0x30;
    bVar1 = pName[1];
    pName = pName + 1;
  } while (bVar1 != 0);
  if (0 < iVar2) {
    Vec_IntPush(&Bac_NameToRanges::Bits,iVar2);
    if (10 < Bac_NameToRanges::Bits.nSize) {
      __assert_fail("Vec_IntSize(vBits) <= 10",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacNtk.c"
                    ,0xc3,"Vec_Int_t *Bac_NameToRanges(char *)");
    }
    return &Bac_NameToRanges::Bits;
  }
LAB_003b3f09:
  __assert_fail("Num > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacNtk.c"
                ,0xc1,"Vec_Int_t *Bac_NameToRanges(char *)");
}

Assistant:

Vec_Int_t * Bac_NameToRanges( char * pName )
{
    static Vec_Int_t Bits, * vBits = &Bits;
    static int pArray[10];
    char * pTemp; 
    int Num = 0, Count = 0;
    // initialize array
    vBits->pArray = pArray;
    vBits->nSize = 0;
    vBits->nCap = 10;
    // check the name
    assert( !strncmp(pName, s_Pref, strlen(s_Pref)) );
    for ( pTemp = pName; *pTemp && !Bac_CharIsDigit(*pTemp); pTemp++ );
    assert( Bac_CharIsDigit(*pTemp) );
    for ( ; *pTemp; pTemp++ )
    {
        if ( Bac_CharIsDigit(*pTemp) )
            Num = 10 * Num + *pTemp - '0';
        else
            Vec_IntPush( vBits, Num ), Count += Num, Num = 0;
    }
    assert( Num > 0 );
    Vec_IntPush( vBits, Num );  Count += Num;
    assert( Vec_IntSize(vBits) <= 10 );
    return vBits;
}